

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basiclu_object.c
# Opt level: O2

lu_int basiclu_obj_factorize(basiclu_object *obj,lu_int *Bbegin,lu_int *Bend,lu_int *Bi,double *Bx)

{
  lu_int lVar1;
  double *Lx;
  lu_int *Li;
  double *xstore;
  lu_int *istore;
  lu_int *Ui;
  double *Ux;
  
  lVar1 = isvalid(obj);
  if (lVar1 == 0) {
    lVar1 = -8;
  }
  else {
    istore = obj->istore;
    xstore = obj->xstore;
    Li = obj->Li;
    Lx = obj->Lx;
    Ui = obj->Ui;
    Ux = obj->Ux;
    lVar1 = 0;
    while (lVar1 = basiclu_factorize(istore,xstore,Li,Lx,Ui,Ux,obj->Wi,obj->Wx,Bbegin,Bend,Bi,Bx,
                                     lVar1), lVar1 == 1) {
      lVar1 = lu_realloc_obj(obj);
      if (lVar1 != 0) {
        return lVar1;
      }
      istore = obj->istore;
      xstore = obj->xstore;
      Li = obj->Li;
      Lx = obj->Lx;
      Ui = obj->Ui;
      Ux = obj->Ux;
      lVar1 = 1;
    }
  }
  return lVar1;
}

Assistant:

lu_int basiclu_obj_factorize(struct basiclu_object *obj, const lu_int *Bbegin,
                             const lu_int *Bend, const lu_int *Bi,
                             const double *Bx)
{
    lu_int status;

    if (!isvalid(obj))
        return BASICLU_ERROR_invalid_object;

    status = basiclu_factorize(obj->istore, obj->xstore, obj->Li, obj->Lx,
                               obj->Ui, obj->Ux, obj->Wi, obj->Wx, Bbegin, Bend,
                               Bi, Bx, 0);

    while (status == BASICLU_REALLOCATE)
    {
        status = lu_realloc_obj(obj);
        if (status != BASICLU_OK)
            break;
        status = basiclu_factorize(obj->istore, obj->xstore, obj->Li, obj->Lx,
                                   obj->Ui, obj->Ux, obj->Wi, obj->Wx, Bbegin,
                                   Bend, Bi, Bx, 1);
    }

    return status;
}